

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compress_HC(char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  void *state;
  int cSize;
  LZ4_streamHC_t *statePtr;
  int compressionLevel_local;
  int dstCapacity_local;
  int srcSize_local;
  char *dst_local;
  char *src_local;
  
  state = malloc(0x40038);
  iVar1 = LZ4_compress_HC_extStateHC(state,src,dst,srcSize,dstCapacity,compressionLevel);
  free(state);
  return iVar1;
}

Assistant:

int LZ4_compress_HC(const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
#if defined(LZ4HC_HEAPMODE) && LZ4HC_HEAPMODE==1
    LZ4_streamHC_t* const statePtr = (LZ4_streamHC_t*)ALLOC(sizeof(LZ4_streamHC_t));
#else
    LZ4_streamHC_t state;
    LZ4_streamHC_t* const statePtr = &state;
#endif
    int const cSize = LZ4_compress_HC_extStateHC(statePtr, src, dst, srcSize, dstCapacity, compressionLevel);
#if defined(LZ4HC_HEAPMODE) && LZ4HC_HEAPMODE==1
    FREEMEM(statePtr);
#endif
    return cSize;
}